

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::IsBufferExecuteReadOnly
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation)

{
  SIZE_T SVar1;
  undefined1 local_48 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  
  memBasicInfo._40_8_ = &this->criticalSection;
  CCLock::Enter((CCLock *)memBasicInfo._40_8_);
  SVar1 = VirtualQuery(allocation->allocation->address,(PMEMORY_BASIC_INFORMATION)local_48,0x30);
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection
            ((AutoRealOrFakeCriticalSection<CriticalSection> *)&memBasicInfo.Type);
  return memBasicInfo.RegionSize._4_4_ == 0x20 && SVar1 != 0;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::IsBufferExecuteReadOnly(TEmitBufferAllocation * allocation)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);
    MEMORY_BASIC_INFORMATION memBasicInfo;
    size_t resultBytes = VirtualQuery(allocation->allocation->address, &memBasicInfo, sizeof(memBasicInfo));
    return resultBytes != 0 && memBasicInfo.Protect == PAGE_EXECUTE_READ;
}